

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_status_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::provider::ProviderStatusTest_test_to_string_Test::TestBody
          (ProviderStatusTest_test_to_string_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  AssertHelper local_110;
  Message local_108;
  key_type local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  key_type local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_4;
  Message local_b8;
  key_type local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  key_type local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  key_type local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  key_type local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ProviderStatusTest_test_to_string_Test *this_local;
  
  local_24 = READY;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_24);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"READY\"","provider_status_map[Provider::Status::READY]",
             (char (*) [6])"READY",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5c = DOWN;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_5c);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_58,"\"DOWN\"","provider_status_map[Provider::Status::DOWN]",
             (char (*) [5])"DOWN",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = CLOSED;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_84);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_80,"\"CLOSED\"",
             "provider_status_map[Provider::Status::CLOSED]",(char (*) [7])"CLOSED",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = UNAVAILABLE;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_ac);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((EqHelper<false> *)local_a8,"\"UNAVAILABLE\"",
             "provider_status_map[Provider::Status::UNAVAILABLE]",(char (*) [12])"UNAVAILABLE",
             pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d4 = DISABLED;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_d4);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_d0,"\"DISABLED\"",
             "provider_status_map[Provider::Status::DISABLED]",(char (*) [9])"DISABLED",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_fc = INVALID;
  pmVar2 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,&local_fc);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_f8,"\"INVALID\"",
             "provider_status_map[Provider::Status::INVALID]",(char (*) [8])"INVALID",pmVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  return;
}

Assistant:

TEST(ProviderStatusTest, test_to_string)
{
    EXPECT_EQ("READY", provider_status_map[Provider::Status::READY]);
    EXPECT_EQ("DOWN", provider_status_map[Provider::Status::DOWN]);
    EXPECT_EQ("CLOSED", provider_status_map[Provider::Status::CLOSED]);
    EXPECT_EQ("UNAVAILABLE", provider_status_map[Provider::Status::UNAVAILABLE]);
    EXPECT_EQ("DISABLED", provider_status_map[Provider::Status::DISABLED]);
    EXPECT_EQ("INVALID", provider_status_map[Provider::Status::INVALID]);
}